

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum
pbrt::G(Integrator *integrator,SamplerHandle sampler,Vertex *v0,Vertex *v1,
       SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Normal3f *pNVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [56];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float __x;
  SampledSpectrum SVar21;
  RNG rng;
  RNG local_30;
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  undefined1 auVar16 [64];
  
  fVar10 = ((v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
           (v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5 -
           ((v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
           (v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((long)&v0->field_2 + 8),
                         ZEXT416((uint)(v0->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high),
                         0x10);
  auVar15._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
  auVar15._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
  auVar15._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
  auVar15._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
  uVar1 = *(undefined8 *)
           &(v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((long)&v1->field_2 + 8),
                         ZEXT416((uint)(v1->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high),
                         0x10);
  auVar7._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
  auVar7._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
  auVar7._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
  auVar7._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
  auVar7 = vsubps_avx(auVar15,auVar7);
  auVar8 = vmovshdup_avx(auVar7);
  fVar13 = auVar7._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar13)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)fVar10));
  auVar8 = vfmadd231ss_fma(auVar15,auVar8,auVar8);
  __x = 1.0 / auVar8._0_4_;
  if (__x < 0.0) {
    fVar9 = sqrtf(__x);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    fVar9 = auVar8._0_4_;
  }
  auVar8._0_4_ = fVar13 * fVar9;
  auVar8._4_4_ = auVar7._4_4_ * fVar9;
  auVar8._8_4_ = auVar7._8_4_ * fVar9;
  auVar8._12_4_ = auVar7._12_4_ * fVar9;
  fVar13 = (v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
  if ((((fVar13 != 0.0) || (NAN(fVar13))) ||
      ((v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
     ((fVar13 = (v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
      fVar13 != 0.0 || (NAN(fVar13))))) {
    pNVar4 = &(v0->field_2).ei.super_Interaction.n;
    if (v0->type == Surface) {
      pNVar4 = (Normal3f *)((v0->field_2).mi.sigma_maj.values.values + 2);
    }
    fVar13 = (pNVar4->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar7 = vmovshdup_avx(auVar8);
    auVar20 = ZEXT416((uint)(auVar7._0_4_ * fVar13));
    auVar15 = vfmadd132ss_fma(ZEXT416((uint)(pNVar4->super_Tuple3<pbrt::Normal3,_float>).y),auVar20,
                              auVar8);
    auVar7 = vfmsub213ss_fma(auVar7,ZEXT416((uint)fVar13),auVar20);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ + auVar7._0_4_)),
                             ZEXT416((uint)(fVar10 * fVar9)),
                             ZEXT416((uint)(pNVar4->super_Tuple3<pbrt::Normal3,_float>).x));
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar7,auVar20);
    __x = __x * auVar7._0_4_;
  }
  fVar13 = (v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
  if (((fVar13 != 0.0) || (NAN(fVar13))) ||
     ((fVar13 = (v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y,
      fVar13 != 0.0 ||
      (((NAN(fVar13) ||
        (fVar13 = (v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
        fVar13 != 0.0)) || (NAN(fVar13))))))) {
    pNVar4 = &(v1->field_2).ei.super_Interaction.n;
    if (v1->type == Surface) {
      pNVar4 = (Normal3f *)((v1->field_2).mi.sigma_maj.values.values + 2);
    }
    uVar5._0_4_ = (pNVar4->super_Tuple3<pbrt::Normal3,_float>).y;
    uVar5._4_4_ = (pNVar4->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar5;
    auVar19._0_4_ = auVar8._0_4_ * (float)(undefined4)uVar5;
    auVar19._4_4_ = auVar8._4_4_ * (float)uVar5._4_4_;
    auVar19._8_4_ = auVar8._8_4_ * 0.0;
    auVar19._12_4_ = auVar8._12_4_ * 0.0;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar19,auVar2);
    auVar7 = vpermi2ps_avx512vl(_DAT_004bc9a0,auVar19,auVar7);
    auVar8 = vfmadd231ps_fma(auVar7,auVar18,auVar8);
    auVar8 = vhaddps_avx(auVar8,auVar8);
    auVar8 = vfmadd132ss_fma(ZEXT416((uint)(fVar10 * fVar9)),auVar8,
                             ZEXT416((uint)(pNVar4->super_Tuple3<pbrt::Normal3,_float>).x));
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar8,auVar3);
    __x = __x * auVar8._0_4_;
  }
  uVar1 = *(undefined8 *)
           &(v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])&v0->field_2,
                         ZEXT416((uint)(v0->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  uVar5 = CONCAT44(((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5,
                   ((float)uVar1 + auVar8._0_4_) * 0.5) * -0x395b586ca42e166b;
  uVar5 = (CONCAT44((int)(uVar5 >> 0x20),
                    ((v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                    (v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5) ^
          ((uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b
          ) * -0x395b586ca42e166b;
  uVar5 = (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b;
  uVar5 = uVar5 >> 0x2f ^ uVar5;
  uVar1 = *(undefined8 *)
           &(v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])&v1->field_2,
                         ZEXT416((uint)(v1->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar11._0_8_ =
       CONCAT44(((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5,
                ((float)uVar1 + auVar8._0_4_) * 0.5);
  auVar11._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
  auVar11._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
  auVar14 = ZEXT856(auVar11._8_8_);
  auVar17 = (undefined1  [56])0x0;
  uVar6 = (CONCAT44(0x4fb7dae8,
                    ((v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                    (v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5) ^
          (((ulong)(auVar11._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
           auVar11._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
          -0x395b586ca42e166b) * -0x395b586ca42e166b;
  uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b;
  local_30.inc = uVar5 * 2 + 1;
  local_30.state =
       ((uVar6 >> 0x2f ^ uVar6) + 1) * 0x5851f42d4c957f2d + uVar5 * -0x4f5c17a566d501a4 + 1;
  SVar21 = Integrator::Tr(integrator,&(v0->field_2).ei.super_Interaction,
                          &(v1->field_2).ei.super_Interaction,lambda,&local_30);
  auVar16._0_8_ = SVar21.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar12._0_8_ = SVar21.values.values._0_8_;
  auVar12._8_56_ = auVar14;
  auVar8 = vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
  fVar10 = __x * auVar8._0_4_;
  fVar13 = __x * auVar8._4_4_;
  auVar8 = CONCAT412(__x * auVar8._12_4_,CONCAT48(__x * auVar8._8_4_,CONCAT44(fVar13,fVar10)));
  auVar8 = vshufpd_avx(auVar8,auVar8,1);
  SVar21.values.values._8_8_ = auVar8._0_8_;
  SVar21.values.values[0] = fVar10;
  SVar21.values.values[1] = fVar13;
  return (SampledSpectrum)SVar21.values.values;
}

Assistant:

SampledSpectrum G(const Integrator &integrator, SamplerHandle sampler, const Vertex &v0,
                  const Vertex &v1, const SampledWavelengths &lambda) {
    Vector3f d = v0.p() - v1.p();
    Float g = 1 / LengthSquared(d);
    d *= std::sqrt(g);
    if (v0.IsOnSurface())
        g *= AbsDot(v0.ns(), d);
    if (v1.IsOnSurface())
        g *= AbsDot(v1.ns(), d);
    RNG rng(Hash(v0.p()), Hash(v1.p()));
    return g * integrator.Tr(v0.GetInteraction(), v1.GetInteraction(), lambda, rng);
}